

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_soup_mesh_builder.cc
# Opt level: O0

unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> __thiscall
draco::TriangleSoupMeshBuilder::Finalize(TriangleSoupMeshBuilder *this)

{
  uint uVar1;
  pointer pMVar2;
  size_type sVar3;
  reference pvVar4;
  vector<signed_char,_std::allocator<signed_char>_> *in_RSI;
  __uniq_ptr_data<draco::Mesh,_std::default_delete<draco::Mesh>,_true,_true> in_RDI;
  size_t i;
  pointer in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  ulong local_18;
  
  pMVar2 = std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>::operator->
                     ((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)0x193a6e);
  uVar1 = (*(pMVar2->super_PointCloud)._vptr_PointCloud[4])();
  if ((uVar1 & 1) == 0) {
    std::unique_ptr<draco::Mesh,std::default_delete<draco::Mesh>>::
    unique_ptr<std::default_delete<draco::Mesh>,void>
              ((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
  }
  else {
    pMVar2 = std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>::operator->
                       ((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)0x193a9c);
    (*(pMVar2->super_PointCloud)._vptr_PointCloud[5])();
    local_18 = 0;
    while( true ) {
      sVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::size(in_RSI);
      if (sVar3 <= local_18) break;
      pvVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[](in_RSI,local_18);
      if (-1 < *pvVar4) {
        in_stack_ffffffffffffffb8 =
             std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>::operator->
                       ((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)0x193af4);
        in_stack_ffffffffffffffc4 = (undefined4)local_18;
        std::vector<signed_char,_std::allocator<signed_char>_>::operator[](in_RSI,local_18);
        Mesh::SetAttributeElementType
                  ((Mesh *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                   (MeshAttributeElementType)in_stack_ffffffffffffffb8);
      }
      local_18 = local_18 + 1;
    }
    std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>::unique_ptr
              ((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)
               in_stack_ffffffffffffffb8);
  }
  return (__uniq_ptr_data<draco::Mesh,_std::default_delete<draco::Mesh>,_true,_true>)
         (tuple<draco::Mesh_*,_std::default_delete<draco::Mesh>_>)
         in_RDI.super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
         super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
         super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Mesh> TriangleSoupMeshBuilder::Finalize() {
#ifdef DRACO_ATTRIBUTE_VALUES_DEDUPLICATION_SUPPORTED
  // First deduplicate attribute values.
  if (!mesh_->DeduplicateAttributeValues()) {
    return nullptr;
  }
#endif
#ifdef DRACO_ATTRIBUTE_INDICES_DEDUPLICATION_SUPPORTED
  // Also deduplicate vertex indices.
  mesh_->DeduplicatePointIds();
#endif
  for (size_t i = 0; i < attribute_element_types_.size(); ++i) {
    if (attribute_element_types_[i] >= 0) {
      mesh_->SetAttributeElementType(
          static_cast<int>(i),
          static_cast<MeshAttributeElementType>(attribute_element_types_[i]));
    }
  }
  return std::move(mesh_);
}